

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

void __thiscall SAT::untrailToPos(SAT *this,vec<Lit> *t,int p)

{
  uint index;
  int iVar1;
  Lit *pLVar2;
  char *pcVar3;
  uint in_EDX;
  vec<Lit> *in_RSI;
  SAT *in_RDI;
  int x;
  int i;
  int in_stack_ffffffffffffffcc;
  uint local_18;
  
  local_18 = vec<Lit>::size(in_RSI);
  while ((int)in_EDX < (int)local_18) {
    pLVar2 = vec<Lit>::operator[](in_RSI,local_18 - 1);
    index = ::var((Lit)pLVar2->x);
    iVar1 = toInt((lbool)0x0);
    in_stack_ffffffffffffffcc = CONCAT13((char)iVar1,(int3)in_stack_ffffffffffffffcc);
    pcVar3 = vec<signed_char>::operator[](&in_RDI->assigns,index);
    *pcVar3 = (char)((uint)in_stack_ffffffffffffffcc >> 0x18);
    insertVarOrder(in_RDI,in_stack_ffffffffffffffcc);
    local_18 = local_18 - 1;
  }
  vec<Lit>::resize(in_RSI,in_EDX);
  return;
}

Assistant:

inline void SAT::untrailToPos(vec<Lit>& t, int p) {
	for (int i = t.size(); i-- > p;) {
		const int x = var(t[i]);
		assigns[x] = toInt(l_Undef);
#if PHASE_SAVING
		if (so.phase_saving >= 1 || (so.phase_saving == 1 && dl >= l0)) polarity[x] = sign(t[i]);
#endif
		insertVarOrder(x);
	}
	t.resize(p);
}